

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O1

string * __thiscall OB::Parg::print_help_abi_cxx11_(string *__return_storage_ptr__,Parg *this)

{
  pointer pbVar1;
  string *psVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  pointer pbVar4;
  const_iterator __begin3;
  pointer piVar5;
  stringstream ss;
  stringstream out;
  long *local_370;
  long local_368;
  long local_360 [2];
  string *local_350;
  pointer local_348;
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((this->description_)._M_string_length != 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(this->name_)._M_dataplus._M_p,(this->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__cxx11::stringstream::stringstream(local_340);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"  ",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(this->description_)._M_dataplus._M_p,
                        (this->description_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__cxx11::stringbuf::str();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_370,local_368);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if (local_370 != local_360) {
      operator_delete(local_370,local_360[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  if ((this->usage_)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Usage: ",7);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(this->usage_)._M_dataplus._M_p,(this->usage_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  if ((this->modes_)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Flags: ",7);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(this->modes_)._M_dataplus._M_p,(this->modes_)._M_string_length);
  }
  if ((this->options_)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\nOptions: ",10);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(this->options_)._M_dataplus._M_p,(this->options_)._M_string_length);
  }
  piVar5 = (this->info_).
           super__Vector_base<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_348 = (this->info_).
              super__Vector_base<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_350 = __return_storage_ptr__;
  if (piVar5 != local_348) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(piVar5->title)._M_dataplus._M_p,
                          (piVar5->title)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      pbVar1 = (piVar5->text).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar4 = (piVar5->text).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1
          ) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"  ",2);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
      piVar5 = piVar5 + 1;
    } while (piVar5 != local_348);
  }
  psVar2 = local_350;
  if ((this->author_)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\nAuthor: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    std::__cxx11::stringstream::stringstream(local_340);
    std::__ostream_insert<char,std::char_traits<char>>(local_330,"  ",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_330,(this->author_)._M_dataplus._M_p,(this->author_)._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_370,local_368);
    if (local_370 != local_360) {
      operator_delete(local_370,local_360[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string print_help() const
  {
    std::stringstream out;
    if (! description_.empty())
    {
      out << name_ << ":" << "\n";
      std::stringstream ss;
      out << "  " << description_ << "\n";
      out << ss.str() << "\n";
    }

    if (! usage_.empty())
    {
      out << "Usage: " << "\n"
        << usage_ << "\n";
    }

    if (! modes_.empty())
    {
      out << "Flags: " << "\n"
        << modes_;
    }

    if (! options_.empty())
    {
      out << "\nOptions: " << "\n"
        << options_;
    }

    if (! info_.empty())
    {
      for (auto const& e : info_)
      {
        out << "\n" << e.title << ":" << "\n";

        for (auto const& t : e.text)
        {
          out << "  " << t << "\n";
        }
      }
    }

    if (! author_.empty())
    {
      out << "\nAuthor: " << "\n";
      std::stringstream ss;
      ss << "  " << author_ << "\n";
      out << ss.str();
    }

    return out.str();
  }